

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

void __thiscall nnad::Matrix<double>::Display(Matrix<double> *this)

{
  ostream *poVar1;
  double dVar2;
  int local_30;
  int local_2c;
  
  for (local_2c = 0; local_2c < this->_Lines; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < this->_Columns; local_30 = local_30 + 1) {
      dVar2 = GetElement(this,&local_2c,&local_30);
      poVar1 = std::ostream::_M_insert<double>(dVar2);
      std::operator<<(poVar1," ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Display()
    {
      for (int i = 0; i < _Lines; i++)
        {
          for (int j = 0; j < _Columns; j++)
            std::cout << this->GetElement(i,j) << " ";
          std::cout << std::endl;
        }
      std::cout << std::endl;
    }